

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

void PHYSFS_freeList(void *list)

{
  void *pvVar1;
  long *plVar2;
  
  if (list != (void *)0x0) {
    pvVar1 = *list;
    if (pvVar1 != (void *)0x0) {
      plVar2 = (long *)((long)list + 8);
      do {
        (*__PHYSFS_AllocatorHooks.Free)(pvVar1);
        pvVar1 = (void *)*plVar2;
        plVar2 = plVar2 + 1;
      } while (pvVar1 != (void *)0x0);
    }
    (*__PHYSFS_AllocatorHooks.Free)(list);
    return;
  }
  return;
}

Assistant:

void PHYSFS_freeList(void *list)
{
    void **i;
    if (list != NULL)
    {
        for (i = (void **) list; *i != NULL; i++)
            allocator.Free(*i);

        allocator.Free(list);
    } /* if */
}